

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateFboTargetCase::render(InvalidateFboTargetCase *this,Surface *dst)

{
  deUint32 dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Context *pCVar5;
  size_type sVar6;
  ContextWrapper *pCVar7;
  deUint32 *local_360;
  bool local_2f5;
  bool local_2f4;
  bool local_2f3;
  bool local_2f2;
  bool local_2f1;
  bool local_2e1;
  Vector<float,_3> local_2e0;
  Vector<float,_3> local_2d4;
  Vector<float,_4> local_2c8;
  Vector<float,_4> local_2b8;
  Vec4 local_2a8;
  Vector<float,_3> local_298;
  Vector<float,_3> local_28c;
  Vector<float,_4> local_280;
  Vector<float,_4> local_270;
  Vec4 local_260;
  deUint32 local_250;
  deUint32 local_24c;
  deUint32 dummyColorRbo;
  deUint32 dummyFbo;
  deUint32 dummyTarget;
  Vector<float,_3> local_238;
  Vector<float,_4> local_22c;
  Vector<float,_4> local_21c;
  Vec4 local_20c [2];
  deUint32 local_1ec;
  undefined1 local_1e8 [4];
  deUint32 flatShaderID;
  FlatColorShader flatShader;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  bool isStencilDiscarded;
  bool isDepthDiscarded;
  bool isColorDiscarded;
  bool isDiscarded;
  Vec4 cScale;
  Vec4 *cBias;
  TextureFormatInfo colorFmtInfo;
  TextureFormat colorFmt;
  deUint32 depthStencilFormat;
  deUint32 colorFormat;
  Surface *dst_local;
  InvalidateFboTargetCase *this_local;
  
  colorFmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(0x8058);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&cBias,(TextureFormat *)(colorFmtInfo.lookupBias.m_data + 2));
  cScale.m_data._8_8_ = &cBias;
  tcu::operator-((tcu *)&fbo,(Vector<float,_4> *)(colorFmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)&cBias);
  local_2e1 = true;
  if ((this->m_boundTarget != 0x8d40) &&
     ((this->m_invalidateTarget != 0x8d40 || (local_2e1 = true, this->m_boundTarget != 0x8ca9)))) {
    local_2e1 = this->m_invalidateTarget == this->m_boundTarget;
  }
  colorRbo._3_1_ = local_2e1;
  local_2f1 = false;
  if (local_2e1 != false) {
    local_2f1 = hasAttachment(&this->m_invalidateAttachments,0x8ce0);
  }
  colorRbo._2_1_ = local_2f1;
  local_2f2 = false;
  if ((colorRbo._3_1_ & 1) != 0) {
    bVar2 = hasAttachment(&this->m_invalidateAttachments,0x8d00);
    local_2f3 = true;
    if (!bVar2) {
      local_2f3 = hasAttachment(&this->m_invalidateAttachments,0x821a);
    }
    local_2f2 = local_2f3;
  }
  colorRbo._1_1_ = local_2f2;
  local_2f4 = false;
  if ((colorRbo._3_1_ & 1) != 0) {
    bVar2 = hasAttachment(&this->m_invalidateAttachments,0x8d20);
    local_2f5 = true;
    if (!bVar2) {
      local_2f5 = hasAttachment(&this->m_invalidateAttachments,0x821a);
    }
    local_2f4 = local_2f5;
  }
  colorRbo._0_1_ = local_2f4;
  depthStencilRbo = 0;
  flatShader.super_ShaderProgram._340_4_ = 0;
  flatShader.super_ShaderProgram.m_hasGeometryShader = false;
  flatShader.super_ShaderProgram._337_3_ = 0;
  FboTestUtil::FlatColorShader::FlatColorShader((FlatColorShader *)local_1e8,TYPE_FLOAT_VEC4);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_1ec = (*pCVar5->_vptr_Context[0x75])(pCVar5,local_1e8);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&flatShader.super_ShaderProgram.field_0x154);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,
             flatShader.super_ShaderProgram._340_4_);
  pCVar7 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar3 = sglr::ContextWrapper::getWidth(pCVar7);
  iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  sglr::ContextWrapper::glRenderbufferStorage(pCVar7,0x8d41,0x8058,iVar3,iVar4);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&flatShader.super_ShaderProgram.m_hasGeometryShader);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,
             flatShader.super_ShaderProgram._336_4_);
  pCVar7 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar3 = sglr::ContextWrapper::getWidth(pCVar7);
  iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  sglr::ContextWrapper::glRenderbufferStorage(pCVar7,0x8d41,0x88f0,iVar3,iVar4);
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthStencilRbo);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthStencilRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,
             flatShader.super_ShaderProgram._340_4_);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0x8d41,
             flatShader.super_ShaderProgram._336_4_);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0x8d41,
             flatShader.super_ShaderProgram._336_4_);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_1ec;
  tcu::Vector<float,_4>::Vector(&local_22c,1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_21c,&local_22c,(Vector<float,_4> *)&fbo);
  tcu::operator+((tcu *)local_20c,&local_21c,(Vector<float,_4> *)cScale.m_data._8_8_);
  FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_1e8,pCVar5,dVar1,local_20c);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_1ec;
  tcu::Vector<float,_3>::Vector(&local_238,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&dummyFbo,1.0,1.0,1.0);
  sglr::drawQuad(pCVar5,dVar1,&local_238,(Vec3 *)&dummyFbo);
  if (this->m_boundTarget != 0x8d40) {
    dummyColorRbo = this->m_boundTarget == 0x8ca9 ^ 0x8ca9;
    local_24c = 0;
    local_250 = 0;
    sglr::ContextWrapper::glGenRenderbuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,&local_250);
    sglr::ContextWrapper::glBindRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,local_250);
    sglr::ContextWrapper::glRenderbufferStorage
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,0x8058,0x40,0x40);
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,&local_24c);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboTestCase).super_ContextWrapper,dummyColorRbo,local_24c);
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,dummyColorRbo,0x8ce0,0x8d41,local_250
              );
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboTestCase).super_ContextWrapper,this->m_boundTarget,depthStencilRbo);
  }
  dVar1 = this->m_invalidateTarget;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->m_invalidateAttachments);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_invalidateAttachments);
  if (bVar2) {
    local_360 = (deUint32 *)0x0;
  }
  else {
    local_360 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_invalidateAttachments,0);
  }
  sglr::ContextWrapper::glInvalidateFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,dVar1,(int)sVar6,local_360);
  if (this->m_boundTarget != 0x8d40) {
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthStencilRbo);
  }
  if ((colorRbo._2_1_ & 1) != 0) {
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_1ec;
    tcu::Vector<float,_4>::Vector(&local_280,0.0,1.0,0.0,1.0);
    tcu::operator*((tcu *)&local_270,&local_280,(Vector<float,_4> *)&fbo);
    tcu::operator+((tcu *)&local_260,&local_270,(Vector<float,_4> *)cScale.m_data._8_8_);
    FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_1e8,pCVar5,dVar1,&local_260);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_1ec;
    tcu::Vector<float,_3>::Vector(&local_28c,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_298,1.0,1.0,0.0);
    sglr::drawQuad(pCVar5,dVar1,&local_28c,&local_298);
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  }
  if ((colorRbo._1_1_ & 1) != 0) {
    sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207);
  }
  if (((byte)colorRbo & 1) == 0) {
    sglr::ContextWrapper::glStencilFunc
              (&(this->super_FboTestCase).super_ContextWrapper,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xbe2);
  sglr::ContextWrapper::glBlendFunc(&(this->super_FboTestCase).super_ContextWrapper,1,1);
  sglr::ContextWrapper::glBlendEquation(&(this->super_FboTestCase).super_ContextWrapper,0x8006);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_1ec;
  tcu::Vector<float,_4>::Vector(&local_2c8,0.0,0.0,1.0,1.0);
  tcu::operator*((tcu *)&local_2b8,&local_2c8,(Vector<float,_4> *)&fbo);
  tcu::operator+((tcu *)&local_2a8,&local_2b8,(Vector<float,_4> *)cScale.m_data._8_8_);
  FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_1e8,pCVar5,dVar1,&local_2a8);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_1ec;
  tcu::Vector<float,_3>::Vector(&local_2d4,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_2e0,1.0,1.0,0.0);
  sglr::drawQuad(pCVar5,dVar1,&local_2d4,&local_2e0);
  iVar3 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar3,iVar4,
             (TextureFormat *)(colorFmtInfo.lookupBias.m_data + 2),
             (Vec4 *)(colorFmtInfo.valueMax.m_data + 2),
             (Vec4 *)(colorFmtInfo.lookupScale.m_data + 2));
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)local_1e8);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32					colorFormat				= GL_RGBA8;
		const deUint32					depthStencilFormat		= GL_DEPTH24_STENCIL8;
		const tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(colorFormat);
		const tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		const tcu::Vec4&				cBias					= colorFmtInfo.valueMin;
		const tcu::Vec4					cScale					= colorFmtInfo.valueMax-colorFmtInfo.valueMin;
		const bool						isDiscarded				= (m_boundTarget == GL_FRAMEBUFFER) ||
																  (m_invalidateTarget == GL_FRAMEBUFFER && m_boundTarget == GL_DRAW_FRAMEBUFFER) ||
																  (m_invalidateTarget == m_boundTarget);
		const bool						isColorDiscarded		= isDiscarded && hasAttachment(m_invalidateAttachments, GL_COLOR_ATTACHMENT0);
		const bool						isDepthDiscarded		= isDiscarded && (hasAttachment(m_invalidateAttachments, GL_DEPTH_ATTACHMENT) || hasAttachment(m_invalidateAttachments, GL_DEPTH_STENCIL_ATTACHMENT));
		const bool						isStencilDiscarded		= isDiscarded && (hasAttachment(m_invalidateAttachments, GL_STENCIL_ATTACHMENT) || hasAttachment(m_invalidateAttachments, GL_DEPTH_STENCIL_ATTACHMENT));

		deUint32						fbo						= 0;
		deUint32						colorRbo				= 0;
		deUint32						depthStencilRbo			= 0;
		FlatColorShader					flatShader				(glu::TYPE_FLOAT_VEC4);
		deUint32						flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		// Create fbo.
		glGenRenderbuffers		(1, &colorRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, colorFormat, getWidth(), getHeight());

		glGenRenderbuffers		(1, &depthStencilRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, depthStencilRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, depthStencilFormat, getWidth(), getHeight());

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Bound FBO to test target and default to other
		if (m_boundTarget != GL_FRAMEBUFFER)
		{
			// Dummy fbo is used as complemeting target (read when discarding draw for example).
			// \note Framework takes care of deleting objects at the end of test case.
			const deUint32	dummyTarget		= m_boundTarget == GL_DRAW_FRAMEBUFFER ?  GL_READ_FRAMEBUFFER : GL_DRAW_FRAMEBUFFER;
			deUint32		dummyFbo		= 0;
			deUint32		dummyColorRbo	= 0;

			glGenRenderbuffers			(1, &dummyColorRbo);
			glBindRenderbuffer			(GL_RENDERBUFFER, dummyColorRbo);
			glRenderbufferStorage		(GL_RENDERBUFFER, GL_RGBA8, 64, 64);
			glGenFramebuffers			(1, &dummyFbo);
			glBindFramebuffer			(dummyTarget, dummyFbo);
			glFramebufferRenderbuffer	(dummyTarget, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, dummyColorRbo);

			glBindFramebuffer			(m_boundTarget, fbo);
		}

		glInvalidateFramebuffer(m_invalidateTarget, (int)m_invalidateAttachments.size(), m_invalidateAttachments.empty() ? DE_NULL : &m_invalidateAttachments[0]);

		if (m_boundTarget != GL_FRAMEBUFFER)
			glBindFramebuffer(GL_FRAMEBUFFER, fbo);

		if (isColorDiscarded)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias);
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if (isDepthDiscarded)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if (!isStencilDiscarded)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}